

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::Load(QHybrid *this)

{
  string *in_RSI;
  
  Load((QHybrid *)
       (&(this->super_QFunctionJAOHInterface).field_0x0 +
       *(long *)((long)this->super_QFunctionJAOHInterface + -0x38)),in_RSI);
  return;
}

Assistant:

void QHybrid::Load(const std::string& filename)
{
    // figure out what _m_horizonLastTimeSteps should be by reading it from disk
    if(_m_horizonLastTimeSteps==0)
    {
        SetOptimizedHorLast(true);
        stringstream ss;
        ss << filename << "_horLast";
        ifstream fp(ss.str().c_str());
        if(!fp)
        {
            stringstream ss1;
            ss1 << "QHybrid::Load: failed to "
               << "open file " << ss.str();
            throw(E(ss1.str()));
        }
        string buffer;
        getline(fp,buffer);
        istringstream is(buffer);
        is >> _m_horizonLastTimeSteps;
    }
    else
        SetOptimizedHorLast(false);

    if(!_m_initialized)
        Initialize();

    {
        stringstream ss;
        ss << filename << "_firstTS";
        QTable::Load(ss.str(),
                     _m_nrJAOHinFirstTS,
                     GetPU()->GetNrJointActions(),
                     _m_QValuesFirstTimeSteps);
    }
    {
        stringstream ss;
        ss << filename << "_lastTS";
        _m_QlastTimeSteps->Load(ss.str());
    }
}